

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O3

void __thiscall
CoreML::TreeEnsembleClassifier::TreeEnsembleClassifier
          (TreeEnsembleClassifier *this,string *predictedClassOutputName,
          string *classProbabilityOutputName,string *description)

{
  string *psVar1;
  element_type *peVar2;
  TypeUnion this_00;
  ModelDescription *pMVar3;
  Model *this_01;
  Model local_40;
  
  Model::Model(&local_40,description);
  TreeEnsembleBase::TreeEnsembleBase(&this->super_TreeEnsembleBase,&local_40,true);
  Model::~Model(&local_40);
  (this->super_TreeEnsembleBase).super_Model._vptr_Model =
       (_func_int **)&PTR__TreeEnsembleRegressor_003c44d0;
  this_01 = (this->super_TreeEnsembleBase).super_Model.m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_01->_oneof_case_[0] == 0x192) {
    this_00 = this_01->Type_;
  }
  else {
    Specification::Model::clear_Type(this_01);
    this_01->_oneof_case_[0] = 0x192;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x30);
    Specification::TreeEnsembleClassifier::TreeEnsembleClassifier(this_00.treeensembleclassifier_);
    (this_01->Type_).treeensembleclassifier_ = (TreeEnsembleClassifier *)this_00;
    this_01 = (this->super_TreeEnsembleBase).super_Model.m_spec.
              super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  this->tree_classifier_parameters = (TreeEnsembleClassifier *)this_00;
  pMVar3 = this_01->description_;
  if (pMVar3 == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    Specification::ModelDescription::ModelDescription(pMVar3);
    this_01->description_ = pMVar3;
  }
  psVar1 = (pMVar3->predictedfeaturename_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&pMVar3->predictedfeaturename_,predictedClassOutputName);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  peVar2 = (this->super_TreeEnsembleBase).super_Model.m_spec.
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pMVar3 = peVar2->description_;
  if (pMVar3 == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    Specification::ModelDescription::ModelDescription(pMVar3);
    peVar2->description_ = pMVar3;
  }
  psVar1 = (pMVar3->predictedprobabilitiesname_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&pMVar3->predictedprobabilitiesname_,classProbabilityOutputName);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  return;
}

Assistant:

TreeEnsembleClassifier::TreeEnsembleClassifier
    (const std::string& predictedClassOutputName,
     const std::string& classProbabilityOutputName,
     const std::string& description)
    : TreeEnsembleBase(Model(description), true /* isClassifier */),
      tree_classifier_parameters(m_spec->mutable_treeensembleclassifier())
    {
        m_spec->mutable_description()->set_predictedfeaturename(predictedClassOutputName);
        m_spec->mutable_description()->set_predictedprobabilitiesname(classProbabilityOutputName);
    }